

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int I420ToI400(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int iVar1;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) && (dst_y != (uint8_t *)0x0 && src_y != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_y = src_y + ~height * src_stride_y;
      src_stride_y = -src_stride_y;
    }
    CopyPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420ToI400(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_u,
               int src_stride_u,
               const uint8_t* src_v,
               int src_stride_v,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  (void)src_u;
  (void)src_stride_u;
  (void)src_v;
  (void)src_stride_v;
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }

  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  return 0;
}